

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  ~Config(this);
  operator_delete(this,0x168);
  return;
}

Assistant:

Config::~Config() = default;